

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

void ewmh_add_window_state(natwm_state *state,xcb_window_t window,xcb_atom_t atom)

{
  xcb_atom_t local_18;
  xcb_window_t local_14;
  xcb_atom_t atom_local;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  local_18 = atom;
  local_14 = window;
  _atom_local = state;
  xcb_change_property(state->xcb,0,window,state->ewmh->_NET_WM_STATE,4,0x20,1,&local_18);
  return;
}

Assistant:

void ewmh_add_window_state(const struct natwm_state *state, xcb_window_t window, xcb_atom_t atom)
{
        xcb_change_property(state->xcb,
                            XCB_PROP_MODE_REPLACE,
                            window,
                            state->ewmh->_NET_WM_STATE,
                            XCB_ATOM_ATOM,
                            32,
                            1,
                            &atom);
}